

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::mousePressEvent(QGraphicsView *this,QMouseEvent *event)

{
  bool bVar1;
  MouseButton MVar2;
  Int IVar3;
  QGraphicsViewPrivate *this_00;
  QMouseEvent *pQVar4;
  QObject *pQVar5;
  socklen_t *in_RCX;
  undefined7 uVar6;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  sockaddr *__addr_00;
  uint __fd;
  QSinglePointEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  bool extendSelection;
  bool isAccepted;
  QGraphicsViewPrivate *d;
  QGraphicsSceneMouseEvent mouseEvent;
  undefined4 in_stack_ffffffffffffff38;
  MouseEventSource in_stack_ffffffffffffff3c;
  QGraphicsViewPrivate *in_stack_ffffffffffffff40;
  QFlagsStorage<Qt::MouseEventFlag> modifiers;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar8;
  uint in_stack_ffffffffffffff58;
  byte bVar9;
  MouseButton in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QCursor local_80;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_78;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsView *)0xa3dd35);
  QGraphicsViewPrivate::storeMouseEvent
            (in_stack_ffffffffffffff40,
             (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  pQVar4 = QEventStorage<QMouseEvent>::operator->(&this_00->lastMouseEvent);
  __fd = 0;
  (**(code **)(*(long *)pQVar4 + 0x10))();
  __addr = extraout_RDX;
  if ((*(uint *)&this_00->field_0x300 & 1) != 0) {
    local_20 = QSinglePointEvent::position((QSinglePointEvent *)0xa3dd86);
    local_10 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    this_00->mousePressViewPoint = local_10;
    __fd = (int)this_00 + 0x358;
    local_30 = mapToScene((QGraphicsView *)this_00,
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    (this_00->mousePressScenePoint).xp = local_30.xp;
    (this_00->mousePressScenePoint).yp = local_30.yp;
    local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa3de16);
    local_38 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    this_00->mousePressScreenPoint = local_38;
    (this_00->lastMouseMoveScenePoint).xp = (this_00->mousePressScenePoint).xp;
    (this_00->lastMouseMoveScenePoint).yp = (this_00->mousePressScenePoint).yp;
    this_00->lastMouseMoveScreenPoint = this_00->mousePressScreenPoint;
    MVar2 = QSinglePointEvent::button(in_RSI);
    in_RCX = (socklen_t *)(ulong)MVar2;
    this_00->mousePressButton = MVar2;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3deb7);
    __addr = extraout_RDX_00;
    if (bVar1) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (Type)((ulong)in_RDI >> 0x20));
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff40);
      QGraphicsSceneEvent::setWidget
                ((QGraphicsSceneEvent *)in_stack_ffffffffffffff40,
                 (QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QGraphicsSceneMouseEvent::setButtonDownScenePos
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff5c,in_RDI);
      QGraphicsSceneMouseEvent::setButtonDownScreenPos
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff5c,(QPoint *)in_RDI);
      modifiers.i = (Int)((ulong)in_RDI >> 0x20);
      QGraphicsSceneMouseEvent::setScenePos
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
                 (QPointF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QGraphicsSceneMouseEvent::setScreenPos
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
                 (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QGraphicsSceneMouseEvent::setLastScenePos
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
                 (QPointF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QGraphicsSceneMouseEvent::setLastScreenPos
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
                 (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff40);
      QGraphicsSceneMouseEvent::setButtons
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,(MouseButtons)modifiers.i);
      QSinglePointEvent::button(in_RSI);
      QGraphicsSceneMouseEvent::setButton
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      QInputEvent::modifiers((QInputEvent *)in_stack_ffffffffffffff40);
      QGraphicsSceneMouseEvent::setModifiers
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
                 (KeyboardModifiers)modifiers.i);
      QMouseEvent::source();
      QGraphicsSceneMouseEvent::setSource
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      in_stack_ffffffffffffff5c = QMouseEvent::flags();
      QGraphicsSceneMouseEvent::setFlags
                ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,(MouseEventFlags)modifiers.i)
      ;
      QEvent::setAccepted((QEvent *)&local_60,false);
      QInputEvent::timestamp((QInputEvent *)in_RSI);
      QGraphicsSceneEvent::setTimestamp
                ((QGraphicsSceneEvent *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
      if (bVar1) {
        ::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3e068);
        qt_sendSpontaneousEvent
                  ((QObject *)in_stack_ffffffffffffff40,
                   (QEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        pQVar5 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3e088)
                  ->super_QObject;
        QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_60);
      }
      bVar1 = QEvent::isAccepted((QEvent *)&local_60);
      in_stack_ffffffffffffff58 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff58);
      uVar6 = (undefined7)((ulong)in_RCX >> 8);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
      pQVar4 = QEventStorage<QMouseEvent>::operator->(&this_00->lastMouseEvent);
      bVar9 = (byte)(in_stack_ffffffffffffff58 >> 0x18);
      in_RCX = (socklen_t *)(CONCAT71(uVar6,bVar9) & 0xffffffffffffff01);
      __fd = bVar9 & 1;
      (**(code **)(*(long *)pQVar4 + 0x10))();
      uVar8 = (uint)((in_stack_ffffffffffffff58 & 0x1000000) != 0);
      QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0xa3e101);
      if (uVar8 != 0) goto LAB_00a3e2af;
      in_stack_ffffffffffffff54 = 0;
      __addr = extraout_RDX_01;
    }
  }
  if ((this_00->dragMode == RubberBandDrag) && ((this_00->rubberBanding & 1U) == 0)) {
    if ((*(uint *)&this_00->field_0x300 & 1) != 0) {
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,in_RCX);
      this_00->rubberBanding = true;
      QRect::QRect((QRect *)in_stack_ffffffffffffff40);
      (this_00->rubberBandRect).x1 = (Representation)(undefined4)local_70;
      (this_00->rubberBandRect).y1 = (Representation)local_70._4_4_;
      (this_00->rubberBandRect).x2 = (Representation)(undefined4)local_68;
      (this_00->rubberBandRect).y2 = (Representation)local_68._4_4_;
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3e19d);
      if (bVar1) {
        local_78.super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorage<Qt::KeyboardModifier>)
             QInputEvent::modifiers((QInputEvent *)in_stack_ffffffffffffff40);
        local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorage<Qt::KeyboardModifier>)
             QFlags<Qt::KeyboardModifier>::operator&
                       ((QFlags<Qt::KeyboardModifier> *)in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff3c);
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
        uVar7 = CONCAT13(IVar3 != 0,(int3)in_stack_ffffffffffffff50);
        if (IVar3 != 0) {
          this_00->rubberBandSelectionOperation = AddToSelection;
        }
        else {
          this_00->rubberBandSelectionOperation = ReplaceSelection;
          QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3e212);
          QGraphicsScene::clearSelection
                    ((QGraphicsScene *)CONCAT44(in_stack_ffffffffffffff54,uVar7));
        }
      }
    }
  }
  else if ((this_00->dragMode == ScrollHandDrag) &&
          (MVar2 = QSinglePointEvent::button(in_RSI), MVar2 == LeftButton)) {
    QEvent::accept((QEvent *)in_RSI,__fd,__addr_00,in_RCX);
    *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xfffffdff | 0x200;
    this_00->handScrollMotions = 0;
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff40);
    QCursor::QCursor(&local_80,ClosedHandCursor);
    QWidget::setCursor((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (QCursor *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QCursor::~QCursor(&local_80);
  }
LAB_00a3e2af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    // Store this event for replaying, finding deltas, and for
    // scroll-dragging; even in non-interactive mode, scroll hand dragging is
    // allowed, so we store the event at the very top of this function.
    d->storeMouseEvent(event);
    d->lastMouseEvent->setAccepted(false);

    if (d->sceneInteractionAllowed) {
        // Store some of the event's button-down data.
        d->mousePressViewPoint = event->position().toPoint();
        d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
        d->mousePressScreenPoint = event->globalPosition().toPoint();
        d->lastMouseMoveScenePoint = d->mousePressScenePoint;
        d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
        d->mousePressButton = event->button();

        if (d->scene) {
            // Convert and deliver the mouse event to the scene.
            QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMousePress);
            mouseEvent.setWidget(viewport());
            mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
            mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
            mouseEvent.setScenePos(d->mousePressScenePoint);
            mouseEvent.setScreenPos(d->mousePressScreenPoint);
            mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
            mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
            mouseEvent.setButtons(event->buttons());
            mouseEvent.setButton(event->button());
            mouseEvent.setModifiers(event->modifiers());
            mouseEvent.setSource(event->source());
            mouseEvent.setFlags(event->flags());
            mouseEvent.setAccepted(false);
            mouseEvent.setTimestamp(event->timestamp());
            if (event->spontaneous())
                qt_sendSpontaneousEvent(d->scene, &mouseEvent);
            else
                QCoreApplication::sendEvent(d->scene, &mouseEvent);

            // Update the original mouse event accepted state.
            bool isAccepted = mouseEvent.isAccepted();
            event->setAccepted(isAccepted);

            // Update the last mouse event accepted state.
            d->lastMouseEvent->setAccepted(isAccepted);

            if (isAccepted)
                return;
        }
    }

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && !d->rubberBanding) {
        if (d->sceneInteractionAllowed) {
            // Rubberbanding is only allowed in interactive mode.
            event->accept();
            d->rubberBanding = true;
            d->rubberBandRect = QRect();
            if (d->scene) {
                bool extendSelection = (event->modifiers() & Qt::ControlModifier) != 0;

                if (extendSelection) {
                    d->rubberBandSelectionOperation = Qt::AddToSelection;
                } else {
                    d->rubberBandSelectionOperation = Qt::ReplaceSelection;
                    d->scene->clearSelection();
                }
            }
        }
    } else
#endif
        if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
            // Left-button press in scroll hand mode initiates hand scrolling.
            event->accept();
            d->handScrolling = true;
            d->handScrollMotions = 0;
#ifndef QT_NO_CURSOR
            viewport()->setCursor(Qt::ClosedHandCursor);
#endif
        }
}